

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O2

void getModulePath(char **path,uint *pathLength)

{
  uchar uVar1;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *executablePath;
  uint local_38;
  uint local_34;
  char *local_30;
  
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    local_30 = (char *)0x0;
    local_34 = 0;
    getExecutablePath(&local_30,&local_34);
    local_38 = 0;
    getDirectoryPart(local_30,local_34,&local_38);
    copyToStringOutParameter(local_30,local_38,path,pathLength);
    free(local_30);
  }
  return;
}

Assistant:

void getModulePath(char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);
    unsigned int executablePathDirectoryLength = 0;

    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    copyToStringOutParameter(executablePath, executablePathDirectoryLength, path, pathLength);

    free(executablePath);
}